

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::UseKeyAndValueFromEntry
          (Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  int iVar1;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ValueMapEntryAccessorType *src;
  Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToStringMap_MapEntry_DoNotUse,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  iVar1 = (*(this->entry_->super_MessageLite)._vptr_MessageLite[0xd])();
  this->key_ = *(long *)CONCAT44(extraout_var,iVar1);
  pbVar2 = Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[]<long>(this->map_,&this->key_);
  this->value_ptr_ = pbVar2;
  src = mutable_value(this->entry_);
  MoveHelper<false,_false,_true,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Move(src,this->value_ptr_);
  return;
}

Assistant:

void UseKeyAndValueFromEntry() {
      // Update key_ in case we need it later (because key() is called).
      // This is potentially inefficient, especially if the key is
      // expensive to copy (e.g., a long string), but this is a cold
      // path, so it's not a big deal.
      key_ = entry_->key();
      value_ptr_ = &(*map_)[key_];
      ValueMover::Move(entry_->mutable_value(), value_ptr_);
    }